

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O3

void dStackCompress(GlobalLU_t *Glu)

{
  int iVar1;
  int_t *piVar2;
  int_t *piVar3;
  int_t *piVar4;
  int_t *old;
  void *pvVar5;
  int iVar6;
  long lVar7;
  double *dnew;
  void *pvVar8;
  int_t *new;
  
  iVar6 = Glu->n;
  piVar2 = Glu->lsub;
  piVar3 = Glu->xlsub;
  piVar4 = Glu->xusub;
  old = Glu->usub;
  pvVar8 = (void *)((long)(Glu->xlusup[iVar6] << 3) + (long)Glu->lusup);
  iVar1 = piVar4[iVar6];
  if (0 < (long)iVar1) {
    pvVar5 = Glu->ucol;
    lVar7 = 0;
    do {
      *(undefined8 *)((long)pvVar8 + lVar7 * 8) = *(undefined8 *)((long)pvVar5 + lVar7 * 8);
      lVar7 = lVar7 + 1;
    } while (iVar1 != lVar7);
  }
  new = (int_t *)((long)(iVar1 << 2) + (long)pvVar8);
  copy_mem_int(piVar3[iVar6],piVar2,new);
  piVar3 = new + piVar3[iVar6];
  copy_mem_int(piVar4[iVar6],old,piVar3);
  iVar1 = (Glu->stack).top1;
  iVar6 = (*(int *)&(Glu->stack).array + iVar1) - ((int)piVar3 + piVar4[iVar6] * 4);
  piVar2 = &(Glu->stack).used;
  *piVar2 = *piVar2 - iVar6;
  (Glu->stack).top1 = iVar1 - iVar6;
  Glu->ucol = pvVar8;
  Glu->lsub = new;
  Glu->usub = piVar3;
  return;
}

Assistant:

void
dStackCompress(GlobalLU_t *Glu)
{
    register int iword, dword, ndim;
    char     *last, *fragment;
    int_t    *ifrom, *ito;
    double   *dfrom, *dto;
    int_t    *xlsub, *lsub, *xusub, *usub, *xlusup;
    double   *ucol, *lusup;
    
    iword = sizeof(int);
    dword = sizeof(double);
    ndim = Glu->n;

    xlsub  = Glu->xlsub;
    lsub   = Glu->lsub;
    xusub  = Glu->xusub;
    usub   = Glu->usub;
    xlusup = Glu->xlusup;
    ucol   = Glu->ucol;
    lusup  = Glu->lusup;
    
    dfrom = ucol;
    dto = (double *)((char*)lusup + xlusup[ndim] * dword);
    copy_mem_double(xusub[ndim], dfrom, dto);
    ucol = dto;

    ifrom = lsub;
    ito = (int_t *) ((char*)ucol + xusub[ndim] * iword);
    copy_mem_int(xlsub[ndim], ifrom, ito);
    lsub = ito;
    
    ifrom = usub;
    ito = (int_t *) ((char*)lsub + xlsub[ndim] * iword);
    copy_mem_int(xusub[ndim], ifrom, ito);
    usub = ito;
    
    last = (char*)usub + xusub[ndim] * iword;
    fragment = (char*) (((char*)Glu->stack.array + Glu->stack.top1) - last);
    Glu->stack.used -= (long int) fragment;
    Glu->stack.top1 -= (long int) fragment;

    Glu->ucol = ucol;
    Glu->lsub = lsub;
    Glu->usub = usub;
    
#if ( DEBUGlevel>=1 )
    printf("dStackCompress: fragment %lld\n", (long long) fragment);
    /* for (last = 0; last < ndim; ++last)
	print_lu_col("After compress:", last, 0);*/
#endif    
    
}